

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void __thiscall
CNetBase::SendPacketConnless
          (CNetBase *this,NETADDR *pAddr,TOKEN Token,TOKEN ResponseToken,void *pData,int DataSize)

{
  long in_FS_OFFSET;
  uchar aBuffer [1400];
  undefined1 local_5b8;
  undefined1 local_5b7;
  undefined1 local_5b6;
  undefined1 local_5b5;
  undefined1 local_5b4;
  undefined1 local_5b3;
  undefined1 local_5b2;
  undefined1 local_5b1;
  undefined1 local_5b0;
  undefined1 local_5af [1399];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network.cpp"
                 ,0x96,(uint)(DataSize < 0x570),"packet data size too high");
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network.cpp"
                 ,0x97,1,"token out of range");
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network.cpp"
                 ,0x98,1,"resp token out of range");
  local_5b8 = 0x21;
  local_5b7 = (undefined1)(Token >> 0x18);
  local_5b6 = (undefined1)(Token >> 0x10);
  local_5b5 = (undefined1)(Token >> 8);
  local_5b4 = (undefined1)Token;
  local_5b3 = (undefined1)(ResponseToken >> 0x18);
  local_5b2 = (undefined1)(ResponseToken >> 0x10);
  local_5b1 = (undefined1)(ResponseToken >> 8);
  local_5b0 = (undefined1)ResponseToken;
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/network.cpp"
                 ,0xa5,1,"inconsistency");
  mem_copy(local_5af,pData,DataSize);
  net_udp_send(this->m_Socket,pAddr,&local_5b8,DataSize + 9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBase::SendPacketConnless(const NETADDR *pAddr, TOKEN Token, TOKEN ResponseToken, const void *pData, int DataSize)
{
	unsigned char aBuffer[NET_MAX_PACKETSIZE];

	dbg_assert(DataSize <= NET_MAX_PAYLOAD, "packet data size too high");
	dbg_assert((Token&~NET_TOKEN_MASK) == 0, "token out of range");
	dbg_assert((ResponseToken&~NET_TOKEN_MASK) == 0, "resp token out of range");

	int i = 0;
	aBuffer[i++] = ((NET_PACKETFLAG_CONNLESS<<2)&0xfc) | (NET_PACKETVERSION&0x03); // connless flag and version
	aBuffer[i++] = (Token>>24)&0xff; // token
	aBuffer[i++] = (Token>>16)&0xff;
	aBuffer[i++] = (Token>>8)&0xff;
	aBuffer[i++] = (Token)&0xff;
	aBuffer[i++] = (ResponseToken>>24)&0xff; // response token
	aBuffer[i++] = (ResponseToken>>16)&0xff;
	aBuffer[i++] = (ResponseToken>>8)&0xff;
	aBuffer[i++] = (ResponseToken)&0xff;

	dbg_assert(i == NET_PACKETHEADERSIZE_CONNLESS, "inconsistency");

	mem_copy(&aBuffer[i], pData, DataSize);
	net_udp_send(m_Socket, pAddr, aBuffer, i+DataSize);
}